

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkCecFraig(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int fVerbose)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  int *piVar2;
  abctime aVar3;
  int *pSimInfo;
  Abc_Ntk_t *pAStack_a0;
  int RetValue;
  Abc_Ntk_t *pExdc;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pMiter;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  abctime clk;
  int fVerbose_local;
  int nSeconds_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  Params.nTotalInspectsMade = Abc_Clock();
  pMiter = (Abc_Ntk_t *)&pParams;
  pAStack_a0 = (Abc_Ntk_t *)0x0;
  if ((pNtk1->pExdc != (Abc_Ntk_t *)0x0) || (pNtk2->pExdc != (Abc_Ntk_t *)0x0)) {
    if ((pNtk1->pExdc == (Abc_Ntk_t *)0x0) || (pNtk2->pExdc == (Abc_Ntk_t *)0x0)) {
      if (pNtk1->pExdc == (Abc_Ntk_t *)0x0) {
        if (pNtk2->pExdc == (Abc_Ntk_t *)0x0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcVerify.c"
                        ,0x98,"void Abc_NtkCecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
        }
        printf(
              "First network has no EXDC. Comparing main networks under EXDC of the second network.\n"
              );
        pAStack_a0 = pNtk2->pExdc;
      }
      else {
        printf(
              "Second network has no EXDC. Comparing main networks under EXDC of the first network.\n"
              );
        pAStack_a0 = pNtk1->pExdc;
      }
    }
    else {
      printf("Comparing EXDC of the two networks:\n");
      Abc_NtkCecFraig(pNtk1->pExdc,pNtk2->pExdc,nSeconds,fVerbose);
      printf("Comparing networks under EXDC of the first network.\n");
      pAStack_a0 = pNtk1->pExdc;
    }
  }
  pTemp = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,0);
  if (pTemp == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.\n");
  }
  else {
    if (pAStack_a0 != (Abc_Ntk_t *)0x0) {
      iVar1 = Abc_NtkPoNum(pTemp);
      if (iVar1 != 1) {
        __assert_fail("Abc_NtkPoNum(pMiter) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcVerify.c"
                      ,0xa5,"void Abc_NtkCecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
      }
      iVar1 = Abc_NtkPoNum(pAStack_a0);
      pNtk = pTemp;
      if (iVar1 != 1) {
        __assert_fail("Abc_NtkPoNum(pExdc) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcVerify.c"
                      ,0xa6,"void Abc_NtkCecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
      }
      pTemp = Abc_NtkMiter(pTemp,pAStack_a0,1,0,1,0);
      Abc_NtkDelete(pNtk);
    }
    iVar1 = Abc_NtkMiterIsConstant(pTemp);
    if (iVar1 == 0) {
      printf("Networks are NOT EQUIVALENT after structural hashing.  ");
      piVar2 = Abc_NtkVerifyGetCleanModel(pTemp,1);
      pTemp->pModel = piVar2;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,pTemp->pModel);
      if (pTemp->pModel != (int *)0x0) {
        free(pTemp->pModel);
        pTemp->pModel = (int *)0x0;
      }
      Abc_NtkDelete(pTemp);
      aVar3 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar3 - Params.nTotalInspectsMade);
    }
    else if (iVar1 == 1) {
      printf("Networks are equivalent after structural hashing.  ");
      Abc_NtkDelete(pTemp);
      aVar3 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar3 - Params.nTotalInspectsMade);
    }
    else {
      Prove_ParamsSetDefault((Prove_Params_t *)pMiter);
      *(undefined4 *)&pMiter->pSpec = 5;
      iVar1 = Abc_NtkIvyProve(&pTemp,pMiter);
      if (iVar1 == -1) {
        printf("Networks are undecided (resource limits is reached).  ");
      }
      else if (iVar1 == 0) {
        piVar2 = Abc_NtkVerifySimulatePattern(pTemp,pTemp->pModel);
        if (*piVar2 == 1) {
          printf("Networks are NOT EQUIVALENT.  ");
        }
        else {
          printf("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
        }
        if (piVar2 != (int *)0x0) {
          free(piVar2);
        }
      }
      else {
        printf("Networks are equivalent.  ");
      }
      aVar3 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar3 - Params.nTotalInspectsMade);
      if (pTemp->pModel != (int *)0x0) {
        Abc_NtkVerifyReportError(pNtk1,pNtk2,pTemp->pModel);
      }
      Abc_NtkDelete(pTemp);
    }
  }
  return;
}

Assistant:

void Abc_NtkCecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose )
{
    abctime clk = Abc_Clock();
    Prove_Params_t Params, * pParams = &Params;
//    Fraig_Params_t Params;
//    Fraig_Man_t * pMan;
    Abc_Ntk_t * pMiter, * pTemp;
    Abc_Ntk_t * pExdc = NULL;
    int RetValue;

    if ( pNtk1->pExdc != NULL || pNtk2->pExdc != NULL )
    {
        if ( pNtk1->pExdc != NULL && pNtk2->pExdc != NULL )
        {
            printf( "Comparing EXDC of the two networks:\n" );
            Abc_NtkCecFraig( pNtk1->pExdc, pNtk2->pExdc, nSeconds, fVerbose );
            printf( "Comparing networks under EXDC of the first network.\n" );
            pExdc = pNtk1->pExdc;
        }
        else if ( pNtk1->pExdc != NULL )
        {
            printf( "Second network has no EXDC. Comparing main networks under EXDC of the first network.\n" );
            pExdc = pNtk1->pExdc;
        }
        else if ( pNtk2->pExdc != NULL ) 
        {
            printf( "First network has no EXDC. Comparing main networks under EXDC of the second network.\n" );
            pExdc = pNtk2->pExdc;
        }
        else assert( 0 );
    }

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    // add EXDC to the miter
    if ( pExdc )
    {
        assert( Abc_NtkPoNum(pMiter) == 1 );
        assert( Abc_NtkPoNum(pExdc) == 1 );
        pMiter = Abc_NtkMiter( pTemp = pMiter, pExdc, 1, 0, 1, 0 );
        Abc_NtkDelete( pTemp );
    }
    // handle trivial case
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.  " );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.  " );
        Abc_NtkDelete( pMiter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        return;
    }
/*
    // convert the miter into a FRAIG
    Fraig_ParamsSetDefault( &Params );
    Params.fVerbose = fVerbose;
    Params.nSeconds = nSeconds;
//    Params.fFuncRed = 0;
//    Params.nPatsRand = 0;
//    Params.nPatsDyna = 0;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pMiter, &Params, 0, 0 ); 
    Fraig_ManProveMiter( pMan );

    // analyze the result
    RetValue = Fraig_ManCheckMiter( pMan );
    // report the result
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out on the final miter).\n" );
    else if ( RetValue == 1 )
        printf( "Networks are equivalent after fraiging.\n" );
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after fraiging.\n" );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, Fraig_ManReadModel(pMan) );
    }
    else assert( 0 );
    // delete the fraig manager
    Fraig_ManFree( pMan );
    // delete the miter
    Abc_NtkDelete( pMiter );
*/
    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
//    RetValue = Abc_NtkMiterProve( &pMiter, pParams );
//    pParams->fVerbose = 1;
    RetValue = Abc_NtkIvyProve( &pMiter, pParams );
    if ( RetValue == -1 )
        printf( "Networks are undecided (resource limits is reached).  " );
    else if ( RetValue == 0 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiter, pMiter->pModel );
        if ( pSimInfo[0] != 1 )
            printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        else
            printf( "Networks are NOT EQUIVALENT.  " );
        ABC_FREE( pSimInfo );
    }
    else
        printf( "Networks are equivalent.  " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( pMiter->pModel )
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
    Abc_NtkDelete( pMiter );
}